

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O3

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_c_coef_controller *pjVar3;
  long lVar4;
  int iVar5;
  boolean bVar6;
  JBLOCKARRAY ppaJVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  JBLOCKROW paJVar14;
  long lVar15;
  long lVar16;
  JBLOCKARRAY buffer [4];
  long alStack_58 [5];
  
  pjVar3 = cinfo->coef;
  if (0 < cinfo->comps_in_scan) {
    lVar16 = 0;
    do {
      JVar1 = cinfo->cur_comp_info[lVar16]->v_samp_factor;
      ppaJVar7 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)
                            (&pjVar3[7].start_pass)[cinfo->cur_comp_info[lVar16]->component_index],
                            *(int *)&pjVar3[1].start_pass * JVar1,JVar1,0);
      alStack_58[lVar16] = (long)ppaJVar7;
      lVar16 = lVar16 + 1;
    } while (lVar16 < cinfo->comps_in_scan);
  }
  lVar16 = (long)*(int *)&pjVar3[1].compress_data;
  iVar5 = *(int *)((long)&pjVar3[1].compress_data + 4);
  if (*(int *)&pjVar3[1].compress_data < iVar5) {
    uVar11 = *(uint *)((long)&pjVar3[1].start_pass + 4);
    uVar8 = cinfo->MCUs_per_row;
    do {
      if (uVar11 < uVar8) {
        do {
          iVar5 = cinfo->comps_in_scan;
          if (0 < (long)iVar5) {
            lVar9 = 0;
            iVar10 = 0;
            do {
              lVar12 = (long)cinfo->cur_comp_info[lVar9]->MCU_height;
              if (0 < lVar12) {
                iVar2 = cinfo->cur_comp_info[lVar9]->MCU_width;
                lVar4 = alStack_58[lVar9];
                lVar13 = 0;
                do {
                  if (0 < iVar2) {
                    paJVar14 = (JBLOCKROW)
                               (*(long *)(lVar4 + lVar16 * 8 + lVar13 * 8) +
                               (ulong)(iVar2 * uVar11) * 0x80);
                    lVar15 = 0;
                    do {
                      (&pjVar3[2].start_pass)[iVar10 + lVar15] =
                           (_func_void_j_compress_ptr_J_BUF_MODE *)paJVar14;
                      paJVar14 = paJVar14 + 1;
                      lVar15 = lVar15 + 1;
                    } while (iVar2 != (int)lVar15);
                    iVar10 = iVar10 + (int)lVar15;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != lVar12);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != iVar5);
          }
          bVar6 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)(pjVar3 + 2));
          if (bVar6 == 0) {
            *(int *)&pjVar3[1].compress_data = (int)lVar16;
            *(uint *)((long)&pjVar3[1].start_pass + 4) = uVar11;
            return 0;
          }
          uVar11 = uVar11 + 1;
          uVar8 = cinfo->MCUs_per_row;
        } while (uVar11 < uVar8);
        iVar5 = *(int *)((long)&pjVar3[1].compress_data + 4);
      }
      *(undefined4 *)((long)&pjVar3[1].start_pass + 4) = 0;
      lVar16 = lVar16 + 1;
      uVar11 = 0;
    } while (lVar16 < iVar5);
  }
  *(int *)&pjVar3[1].start_pass = *(int *)&pjVar3[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_output(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan.
   * NB: during first pass, this is safe only because the buffers will
   * already be aligned properly, so jmemmgr.c won't need to do any I/O.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
         MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;                 /* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        start_col = MCU_col_num * compptr->MCU_width;
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          buffer_ptr = buffer[ci][yindex + yoffset] + start_col;
          for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
            coef->MCU_buffer[blkn++] = buffer_ptr++;
          }
        }
      }
      /* Try to write the MCU. */
      if (!(*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->mcu_ctr = MCU_col_num;
        return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}